

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

iuIParamGenerator<std::tuple<bool,_int,_int>_> * __thiscall
iutest::detail::iuConcatParamHolder::operator_cast_to_iuIParamGenerator_(iuConcatParamHolder *this)

{
  iuIParamGenerator<std::tuple<bool,_int,_int>_> *piVar1;
  iuValuesInParamsGenerator<std::tuple<bool,_int,_int>_> *this_00;
  undefined1 local_28 [8];
  params_t<std::tuple<bool,_int,_int>_> params;
  iuConcatParamHolder<iutest::detail::iuCartesianProductHolder<iutest::detail::iuValueArray<bool>,_iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<int>_>,_iutest::detail::iuCartesianProductHolder<iutest::detail::iuValueArray<bool>,_iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<int>_>_>
  *this_local;
  
  params.val.
  super__Vector_base<std::tuple<bool,_int,_int>,_std::allocator<std::tuple<bool,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  iuConcatParamHolder<iutest::detail::iuCartesianProductHolder<iutest::detail::iuValueArray<bool>,_iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<int>_>,_iutest::detail::iuCartesianProductHolder<iutest::detail::iuValueArray<bool>,_iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<int>_>_>
  ::params_t<std::tuple<bool,_int,_int>_>::params_t
            ((params_t<std::tuple<bool,_int,_int>_> *)local_28);
  piVar1 = iuCartesianProductHolder::operator_cast_to_iuIParamGenerator_
                     ((iuCartesianProductHolder *)this);
  iuConcatParamHolder<iutest::detail::iuCartesianProductHolder<iutest::detail::iuValueArray<bool>,_iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<int>_>,_iutest::detail::iuCartesianProductHolder<iutest::detail::iuValueArray<bool>,_iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<int>_>_>
  ::params_t<std::tuple<bool,_int,_int>_>::append
            ((params_t<std::tuple<bool,_int,_int>_> *)local_28,piVar1);
  piVar1 = iuCartesianProductHolder::operator_cast_to_iuIParamGenerator_
                     ((iuCartesianProductHolder *)(this + 0x20));
  iuConcatParamHolder<iutest::detail::iuCartesianProductHolder<iutest::detail::iuValueArray<bool>,_iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<int>_>,_iutest::detail::iuCartesianProductHolder<iutest::detail::iuValueArray<bool>,_iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<int>_>_>
  ::params_t<std::tuple<bool,_int,_int>_>::append
            ((params_t<std::tuple<bool,_int,_int>_> *)local_28,piVar1);
  this_00 = (iuValuesInParamsGenerator<std::tuple<bool,_int,_int>_> *)operator_new(0x28);
  iuValuesInParamsGenerator<std::tuple<bool,_int,_int>_>::iuValuesInParamsGenerator
            (this_00,(params_t *)local_28);
  iuConcatParamHolder<iutest::detail::iuCartesianProductHolder<iutest::detail::iuValueArray<bool>,_iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<int>_>,_iutest::detail::iuCartesianProductHolder<iutest::detail::iuValueArray<bool>,_iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<int>_>_>
  ::params_t<std::tuple<bool,_int,_int>_>::~params_t
            ((params_t<std::tuple<bool,_int,_int>_> *)local_28);
  return &this_00->super_iuIParamGenerator<std::tuple<bool,_int,_int>_>;
}

Assistant:

operator iuIParamGenerator<T>* ()
    {
        params_t<T> params;
        params.append(m_g1);
        params.append(m_g2);
        return new iuValuesInParamsGenerator<T>(params.val);
    }